

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O0

double benchmark::ChildrenCPUUsage(void)

{
  int iVar1;
  rusage ru;
  rusage local_98;
  double local_8;
  
  iVar1 = getrusage(RUSAGE_CHILDREN,&local_98);
  if (iVar1 == 0) {
    local_8 = (double)local_98.ru_stime.tv_usec * 1e-06 +
              (double)local_98.ru_utime.tv_usec * 1e-06 + (double)local_98.ru_utime.tv_sec +
              (double)local_98.ru_stime.tv_sec;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

double ChildrenCPUUsage() {
#ifndef BENCHMARK_OS_WINDOWS
  struct rusage ru;
  if (getrusage(RUSAGE_CHILDREN, &ru) == 0) {
    return (static_cast<double>(ru.ru_utime.tv_sec) +
            static_cast<double>(ru.ru_utime.tv_usec) * 1e-6 +
            static_cast<double>(ru.ru_stime.tv_sec) +
            static_cast<double>(ru.ru_stime.tv_usec) * 1e-6);
  } else {
    return 0.0;
  }
#else
  // TODO: Not sure what this even means on Windows
  return 0.0;
#endif  // OS_WINDOWS
}